

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall CLI::App::add_flag(App *this,string *flag_name,string *description)

{
  Option *pOVar1;
  IncorrectConstruction *__return_storage_ptr__;
  callback_t fun;
  string local_a0;
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  local_80;
  string local_60;
  string local_40;
  
  fun.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  fun.super__Function_base._M_functor._8_8_ = 0;
  fun._M_invoker =
       std::
       _Function_handler<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/tiwariashish86[P]IXWebSocket/ws/../third_party/cli11/CLI11.hpp:2724:31)>
       ::_M_invoke;
  fun.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/tiwariashish86[P]IXWebSocket/ws/../third_party/cli11/CLI11.hpp:2724:31)>
       ::_M_manager;
  ::std::__cxx11::string::string((string *)&local_60,(string *)flag_name);
  std::
  function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
  ::function(&local_80,&fun);
  ::std::__cxx11::string::string((string *)&local_a0,(string *)description);
  pOVar1 = add_option(this,&local_60,&local_80,&local_a0,false);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_80);
  ::std::__cxx11::string::~string((string *)&local_60);
  if ((pOVar1->pname_)._M_string_length == 0) {
    pOVar1->type_size_ = 0;
    (pOVar1->super_OptionBase<CLI::Option>).required_ = false;
    ::std::_Function_base::~_Function_base((_Function_base *)&fun);
    return pOVar1;
  }
  __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
  ::std::__cxx11::string::string((string *)&local_40,(string *)flag_name);
  IncorrectConstruction::PositionalFlag(__return_storage_ptr__,&local_40);
  __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,Error::~Error);
}

Assistant:

Option *add_flag(std::string flag_name, std::string description = "") {
        CLI::callback_t fun = [](CLI::results_t) { return true; };

        Option *opt = add_option(flag_name, fun, description, false);
        if(opt->get_positional())
            throw IncorrectConstruction::PositionalFlag(flag_name);
        opt->type_size(0);
        return opt;
    }